

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O2

Expression * __thiscall wasm::AlignmentLowering::lowerLoadI32(AlignmentLowering *this,Load *curr)

{
  Name *pNVar1;
  Builder *pBVar2;
  ulong uVar3;
  Type type;
  Module *pMVar4;
  address64_t aVar5;
  char *pcVar6;
  Index index;
  Memory *pMVar7;
  LocalGet *pLVar8;
  Load *pLVar9;
  Load *pLVar10;
  Const *pCVar11;
  Binary *pBVar12;
  MixedArena *pMVar13;
  undefined1 local_80 [40];
  Builder builder;
  
  uVar3 = (curr->align).addr;
  if ((uVar3 != 0) && (uVar3 != curr->bytes)) {
    pMVar7 = Module::getMemory((this->
                               super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                               ).
                               super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .
                               super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                               .currModule,(Name)(curr->memory).super_IString.str);
    type.id = (pMVar7->indexType).id;
    pMVar4 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
             ).
             super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
             .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
             currModule;
    local_80._32_8_ = pMVar4;
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id != 2) {
      __assert_fail("curr->type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                    ,0x28,"Expression *wasm::AlignmentLowering::lowerLoadI32(Load *)");
    }
    pNVar1 = &curr->memory;
    local_80._16_8_ = this;
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,type);
    local_80._24_8_ = pNVar1;
    if (curr->bytes == '\x04') {
      aVar5 = (curr->align).addr;
      if (aVar5 == 2) {
        aVar5 = (curr->offset).addr;
        pMVar13 = &pMVar4->allocator;
        pLVar8 = MixedArena::alloc<wasm::LocalGet>(pMVar13);
        pLVar8->index = index;
        (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             type.id;
        builder.wasm = (Module *)(pNVar1->super_IString).str._M_len;
        pcVar6 = (curr->memory).super_IString.str._M_str;
        pLVar9 = MixedArena::alloc<wasm::Load>(pMVar13);
        pLVar9->isAtomic = false;
        pLVar9->bytes = '\x02';
        pLVar9->signed_ = false;
        (pLVar9->offset).addr = aVar5;
        (pLVar9->align).addr = 2;
        pLVar9->ptr = (Expression *)pLVar8;
        (pLVar9->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
        (pLVar9->memory).super_IString.str._M_len = (size_t)builder.wasm;
        (pLVar9->memory).super_IString.str._M_str = pcVar6;
        aVar5 = (curr->offset).addr;
        pLVar8 = MixedArena::alloc<wasm::LocalGet>(pMVar13);
        pLVar8->index = index;
        (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             type.id;
        builder.wasm = (Module *)(((IString *)local_80._24_8_)->str)._M_len;
        pcVar6 = (((IString *)local_80._24_8_)->str)._M_str;
        pLVar10 = MixedArena::alloc<wasm::Load>(pMVar13);
        pLVar10->isAtomic = false;
        pLVar10->bytes = '\x02';
        pLVar10->signed_ = false;
        (pLVar10->offset).addr = aVar5 + 2;
        (pLVar10->align).addr = 2;
        pLVar10->ptr = (Expression *)pLVar8;
        (pLVar10->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
        (pLVar10->memory).super_IString.str._M_len = (size_t)builder.wasm;
        (pLVar10->memory).super_IString.str._M_str = pcVar6;
        pCVar11 = Builder::makeConst<int>((Builder *)(local_80 + 0x20),0x10);
        pBVar12 = Builder::makeBinary((Builder *)(local_80 + 0x20),ShlInt32,(Expression *)pLVar10,
                                      (Expression *)pCVar11);
      }
      else {
        if (aVar5 != 1) {
          handle_unreachable("invalid alignment",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                             ,0x84);
        }
        aVar5 = (curr->offset).addr;
        pMVar13 = &pMVar4->allocator;
        pLVar8 = MixedArena::alloc<wasm::LocalGet>(pMVar13);
        pLVar8->index = index;
        (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             type.id;
        builder.wasm = (Module *)(pNVar1->super_IString).str._M_len;
        pcVar6 = (curr->memory).super_IString.str._M_str;
        pLVar9 = MixedArena::alloc<wasm::Load>(pMVar13);
        pLVar9->isAtomic = false;
        pLVar9->bytes = '\x01';
        pLVar9->signed_ = false;
        (pLVar9->offset).addr = aVar5;
        (pLVar9->align).addr = 1;
        pLVar9->ptr = (Expression *)pLVar8;
        (pLVar9->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
        (pLVar9->memory).super_IString.str._M_len = (size_t)builder.wasm;
        (pLVar9->memory).super_IString.str._M_str = pcVar6;
        aVar5 = (curr->offset).addr;
        pLVar8 = MixedArena::alloc<wasm::LocalGet>(pMVar13);
        pLVar8->index = index;
        (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             type.id;
        builder.wasm = (Module *)(((IString *)local_80._24_8_)->str)._M_len;
        pcVar6 = (((IString *)local_80._24_8_)->str)._M_str;
        pLVar10 = MixedArena::alloc<wasm::Load>(pMVar13);
        pLVar10->isAtomic = false;
        pLVar10->bytes = '\x01';
        pLVar10->signed_ = false;
        (pLVar10->offset).addr = aVar5 + 1;
        (pLVar10->align).addr = 1;
        pLVar10->ptr = (Expression *)pLVar8;
        (pLVar10->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
        (pLVar10->memory).super_IString.str._M_len = (size_t)builder.wasm;
        (pLVar10->memory).super_IString.str._M_str = pcVar6;
        pBVar2 = (Builder *)(local_80 + 0x20);
        pCVar11 = Builder::makeConst<int>(pBVar2,8);
        pBVar12 = Builder::makeBinary(pBVar2,ShlInt32,(Expression *)pLVar10,(Expression *)pCVar11);
        pLVar9 = (Load *)Builder::makeBinary(pBVar2,OrInt32,(Expression *)pLVar9,
                                             (Expression *)pBVar12);
        aVar5 = (curr->offset).addr;
        pLVar8 = MixedArena::alloc<wasm::LocalGet>((MixedArena *)(local_80._32_8_ + 0x158));
        pLVar8->index = index;
        (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             type.id;
        builder.wasm = (Module *)(((IString *)local_80._24_8_)->str)._M_len;
        pcVar6 = (((IString *)local_80._24_8_)->str)._M_str;
        pLVar10 = MixedArena::alloc<wasm::Load>((MixedArena *)(local_80._32_8_ + 0x158));
        pLVar10->isAtomic = false;
        pLVar10->bytes = '\x01';
        pLVar10->signed_ = false;
        (pLVar10->offset).addr = aVar5 + 2;
        (pLVar10->align).addr = 1;
        pLVar10->ptr = (Expression *)pLVar8;
        (pLVar10->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
        (pLVar10->memory).super_IString.str._M_len = (size_t)builder.wasm;
        (pLVar10->memory).super_IString.str._M_str = pcVar6;
        pCVar11 = Builder::makeConst<int>((Builder *)(local_80 + 0x20),0x10);
        local_80._16_8_ =
             Builder::makeBinary((Builder *)(local_80 + 0x20),ShlInt32,(Expression *)pLVar10,
                                 (Expression *)pCVar11);
        aVar5 = (curr->offset).addr;
        pLVar8 = MixedArena::alloc<wasm::LocalGet>((MixedArena *)(local_80._32_8_ + 0x158));
        pLVar8->index = index;
        (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             type.id;
        builder.wasm = (Module *)(((IString *)local_80._24_8_)->str)._M_len;
        pcVar6 = (((IString *)local_80._24_8_)->str)._M_str;
        pLVar10 = MixedArena::alloc<wasm::Load>((MixedArena *)(local_80._32_8_ + 0x158));
        pLVar10->isAtomic = false;
        pLVar10->bytes = '\x01';
        pLVar10->signed_ = false;
        (pLVar10->offset).addr = aVar5 + 3;
        (pLVar10->align).addr = 1;
        pLVar10->ptr = (Expression *)pLVar8;
        (pLVar10->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
        (pLVar10->memory).super_IString.str._M_len = (size_t)builder.wasm;
        (pLVar10->memory).super_IString.str._M_str = pcVar6;
        pBVar2 = (Builder *)(local_80 + 0x20);
        pCVar11 = Builder::makeConst<int>(pBVar2,0x18);
        pBVar12 = Builder::makeBinary(pBVar2,ShlInt32,(Expression *)pLVar10,(Expression *)pCVar11);
        pBVar12 = Builder::makeBinary(pBVar2,OrInt32,(Expression *)local_80._16_8_,
                                      (Expression *)pBVar12);
      }
      pBVar12 = Builder::makeBinary((Builder *)(local_80 + 0x20),OrInt32,(Expression *)pLVar9,
                                    (Expression *)pBVar12);
    }
    else {
      if (curr->bytes != '\x02') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0x87);
      }
      aVar5 = (curr->offset).addr;
      pMVar13 = &pMVar4->allocator;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(pMVar13);
      pLVar8->index = index;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id
      ;
      builder.wasm = (Module *)(pNVar1->super_IString).str._M_len;
      pcVar6 = (curr->memory).super_IString.str._M_str;
      pLVar9 = MixedArena::alloc<wasm::Load>(pMVar13);
      pLVar9->isAtomic = false;
      pLVar9->bytes = '\x01';
      pLVar9->signed_ = false;
      (pLVar9->offset).addr = aVar5;
      (pLVar9->align).addr = 1;
      pLVar9->ptr = (Expression *)pLVar8;
      (pLVar9->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
      (pLVar9->memory).super_IString.str._M_len = (size_t)builder.wasm;
      (pLVar9->memory).super_IString.str._M_str = pcVar6;
      aVar5 = (curr->offset).addr;
      pLVar8 = MixedArena::alloc<wasm::LocalGet>(pMVar13);
      pLVar8->index = index;
      (pLVar8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = type.id
      ;
      builder.wasm = (Module *)(((IString *)local_80._24_8_)->str)._M_len;
      pcVar6 = (((IString *)local_80._24_8_)->str)._M_str;
      pLVar10 = MixedArena::alloc<wasm::Load>(pMVar13);
      pLVar10->isAtomic = false;
      pLVar10->bytes = '\x01';
      pLVar10->signed_ = false;
      (pLVar10->offset).addr = aVar5 + 1;
      (pLVar10->align).addr = 1;
      pLVar10->ptr = (Expression *)pLVar8;
      (pLVar10->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
      (pLVar10->memory).super_IString.str._M_len = (size_t)builder.wasm;
      (pLVar10->memory).super_IString.str._M_str = pcVar6;
      pBVar2 = (Builder *)(local_80 + 0x20);
      pCVar11 = Builder::makeConst<int>(pBVar2,8);
      pBVar12 = Builder::makeBinary(pBVar2,ShlInt32,(Expression *)pLVar10,(Expression *)pCVar11);
      pBVar12 = Builder::makeBinary(pBVar2,OrInt32,(Expression *)pLVar9,(Expression *)pBVar12);
      if (curr->signed_ == true) {
        pBVar12 = (Binary *)
                  Bits::makeSignExt((Expression *)pBVar12,2,
                                    *(Module **)&((Binary *)(local_80._16_8_ + 0xf0))->op);
      }
    }
    local_80._0_8_ = Builder::makeLocalSet((Builder *)(local_80 + 0x20),index,curr->ptr);
    builder.wasm = (Module *)local_80;
    local_80._8_8_ = pBVar12;
    curr = (Load *)Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             ((Builder *)(local_80 + 0x20),
                              (initializer_list<wasm::Expression_*> *)&builder);
  }
  return (Expression *)curr;
}

Assistant:

Expression* lowerLoadI32(Load* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    Builder builder(*getModule());
    assert(curr->type == Type::i32);
    auto temp = builder.addVar(getFunction(), indexType);
    Expression* ret;
    if (curr->bytes == 2) {
      ret = builder.makeBinary(
        OrInt32,
        builder.makeLoad(1,
                         false,
                         curr->offset,
                         1,
                         builder.makeLocalGet(temp, indexType),
                         Type::i32,
                         curr->memory),
        builder.makeBinary(
          ShlInt32,
          builder.makeLoad(1,
                           false,
                           curr->offset + 1,
                           1,
                           builder.makeLocalGet(temp, indexType),
                           Type::i32,
                           curr->memory),
          builder.makeConst(int32_t(8))));
      if (curr->signed_) {
        ret = Bits::makeSignExt(ret, 2, *getModule());
      }
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        ret = builder.makeBinary(
          OrInt32,
          builder.makeBinary(
            OrInt32,
            builder.makeLoad(1,
                             false,
                             curr->offset,
                             1,
                             builder.makeLocalGet(temp, indexType),
                             Type::i32,
                             curr->memory),
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 1,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(8)))),
          builder.makeBinary(
            OrInt32,
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 2,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(16))),
            builder.makeBinary(
              ShlInt32,
              builder.makeLoad(1,
                               false,
                               curr->offset + 3,
                               1,
                               builder.makeLocalGet(temp, indexType),
                               Type::i32,
                               curr->memory),
              builder.makeConst(int32_t(24)))));
      } else if (curr->align == 2) {
        ret = builder.makeBinary(
          OrInt32,
          builder.makeLoad(2,
                           false,
                           curr->offset,
                           2,
                           builder.makeLocalGet(temp, indexType),
                           Type::i32,
                           curr->memory),
          builder.makeBinary(
            ShlInt32,
            builder.makeLoad(2,
                             false,
                             curr->offset + 2,
                             2,
                             builder.makeLocalGet(temp, indexType),
                             Type::i32,
                             curr->memory),
            builder.makeConst(int32_t(16))));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    return builder.makeBlock({builder.makeLocalSet(temp, curr->ptr), ret});
  }